

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SDL12_compat.c
# Opt level: O0

void * LoadSDL20Symbol(char *fn,int *okay)

{
  char *dst;
  char *p;
  void *retval;
  int *okay_local;
  char *fn_local;
  
  p = (char *)0x0;
  if ((*okay != 0) && (p = (char *)dlsym(Loaded_SDL20,fn), p == (char *)0x0)) {
    dst = SDL12COMPAT_stpcpy(loaderror,fn);
    SDL12COMPAT_stpcpy(dst," missing in SDL2 library.");
    *okay = 0;
  }
  return p;
}

Assistant:

static void *
LoadSDL20Symbol(const char *fn, int *okay)
{
    void *retval = NULL;
    if (*okay) { /* only bother trying if we haven't previously failed. */
        retval = LookupSDL20Sym(fn);
        if (retval == NULL) {
            char *p = SDL12COMPAT_stpcpy(loaderror, fn);
            SDL12COMPAT_stpcpy(p, " missing in SDL2 library.");
            *okay = 0;
        }
    }
    return retval;
}